

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnLayerSupportVectorMachine.cpp
# Opt level: O1

bool __thiscall tfs::DnnLayerSupportVectorMachine::runForward(DnnLayerSupportVectorMachine *this)

{
  Matrix *pMVar1;
  Matrix *pMVar2;
  size_t __n;
  bool bVar3;
  
  pMVar1 = (this->super_DnnLayer).m_in_a;
  if (((((pMVar1 != (Matrix *)0x0) && (pMVar1->m_data != (double *)0x0)) &&
       (pMVar1->m_data <= pMVar1->m_end)) &&
      ((pMVar2 = (this->super_DnnLayer).m_out_a, pMVar2 != (Matrix *)0x0 &&
       (pMVar2->m_data != (double *)0x0)))) && (pMVar2->m_data <= pMVar2->m_end)) {
    if (((pMVar2->m_data != (double *)0x0) && (pMVar1->m_data != (double *)0x0)) &&
       ((__n = pMVar2->m_length, __n != 0 && (__n == pMVar1->m_length)))) {
      memcpy(pMVar2->m_data,pMVar1->m_data,__n);
    }
    return true;
  }
  bVar3 = report_problem("Error",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnLayerSupportVectorMachine.cpp"
                         ,"runForward",0x1c,"Not configured");
  return bVar3;
}

Assistant:

bool
    DnnLayerSupportVectorMachine::runForward(  void ) {
        // -----------------------------------------------------------------------------------
        // virtual: Forward propagate, used with forward()
        // -----------------------------------------------------------------------------------
        if( matrixBad( m_in_a ) || matrixBad( m_out_a )) {
            return log_error( "Not configured" );
        }
        m_out_a->copy( *m_in_a );   // Simple identity
        return true;
    }